

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Parsing.c
# Opt level: O3

WJTL_STATUS VerifyJsonParsesAsNumberObjectFloat(_Bool IsJson5,char *Json,double Number)

{
  WJTL_STATUS WVar1;
  JL_STATUS JVar2;
  JL_STATUS JVar3;
  bool Condition;
  JlDataObject *object;
  size_t errorAtPos;
  double numfloat;
  JlDataObject *local_60;
  double local_58;
  double local_50;
  size_t local_48;
  size_t local_40;
  double local_38;
  
  local_60 = (JlDataObject *)0x0;
  local_40 = 100;
  local_58 = Number;
  WVar1 = JlParseJsonEx(Json,IsJson5,&local_60,&local_40);
  Condition = WVar1 == WJTL_STATUS_SUCCESS;
  if (!Condition) {
    WVar1 = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(Condition,
                   "((JL_STATUS)(JlParseJsonEx( Json, IsJson5, &object, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsNumberObjectFloat",0x11a);
  if (local_60 != (JlDataObject *)0x0) {
    WjTestLib_Assert(true,"(object) != NULL",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsNumberObjectFloat",0x11d);
    local_48 = local_40;
    WjTestLib_Assert(local_40 == 0,"errorAtPos == 0",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsNumberObjectFloat",0x11e);
    JVar2 = JlGetObjectNumberF64(local_60,&local_38);
    WjTestLib_Assert(JVar2 == JL_STATUS_SUCCESS,
                     "((JL_STATUS)(JlGetObjectNumberF64( object, &numfloat ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsNumberObjectFloat",0x120);
    local_50 = local_38;
    WjTestLib_Assert((_Bool)(-(local_58 == local_38) & 1),"Number == numfloat",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsNumberObjectFloat",0x121);
    JVar3 = JlFreeObjectTree(&local_60);
    WjTestLib_Assert(JVar3 == JL_STATUS_SUCCESS,
                     "((JL_STATUS)(JlFreeObjectTree( &object ))) == (JL_STATUS_SUCCESS)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsNumberObjectFloat",0x123);
    if (local_60 != (JlDataObject *)0x0) {
      WVar1 = WJTL_STATUS_FAILED;
    }
    if (JVar3 != JL_STATUS_SUCCESS) {
      WVar1 = WJTL_STATUS_FAILED;
    }
    if (local_58 != local_50) {
      WVar1 = WJTL_STATUS_FAILED;
    }
    if (NAN(local_58) || NAN(local_50)) {
      WVar1 = WJTL_STATUS_FAILED;
    }
    if (JVar2 != JL_STATUS_SUCCESS) {
      WVar1 = WJTL_STATUS_FAILED;
    }
    if (local_48 != 0) {
      WVar1 = WJTL_STATUS_FAILED;
    }
    WjTestLib_Assert(local_60 == (JlDataObject *)0x0,"(object) == NULL",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsNumberObjectFloat",0x124);
  }
  return WVar1;
}

Assistant:

static
WJTL_STATUS
    VerifyJsonParsesAsNumberObjectFloat
    (
        bool            IsJson5,
        char const*     Json,
        double          Number
    )
{
    JlDataObject*   object = NULL;
    size_t          errorAtPos = 100;
    WJTL_STATUS     TestReturn = WJTL_STATUS_SUCCESS;
    double          numfloat;

    JL_ASSERT_SUCCESS( JlParseJsonEx( Json, IsJson5, &object, &errorAtPos ) );
    if( NULL != object )
    {
        JL_ASSERT_NOT_NULL( object );
        JL_ASSERT( errorAtPos == 0 );

        JL_ASSERT_SUCCESS( JlGetObjectNumberF64( object, &numfloat ) );
        JL_ASSERT( Number == numfloat );

        JL_ASSERT_SUCCESS( JlFreeObjectTree( &object ) );
        JL_ASSERT_NULL( object );
    }

    return TestReturn;
}